

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeType>::reallocate
          (QMovableArrayOps<QMimeType> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QMimeType>_*,_QMimeType_*> pVar1;
  
  pVar1 = QTypedArrayData<QMimeType>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.d,
                     (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.
                     ptr,alloc,option);
  if (pVar1.second != (QMimeType *)0x0) {
    (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.d = pVar1.first;
    (this->super_QGenericArrayOps<QMimeType>).super_QArrayDataPointer<QMimeType>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }